

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3d5b::Reactor::printItem(Reactor *this,JSON *j)

{
  ostream *poVar1;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  JSON::getStart((JSON *)this);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  JSON::getEnd((JSON *)this);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
  poVar1 = std::operator<<(poVar1,"): ");
  JSON::unparse_abi_cxx11_(&sStack_38,(JSON *)this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void
Reactor::printItem(JSON const& j)
{
    std::cout << "[" << j.getStart() << ", " << j.getEnd() << "): " << j.unparse() << std::endl;
}